

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::DecommitPages
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,char *address,size_t pageCount)

{
  PageMemoryData *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t *psVar5;
  size_t dwSize;
  
  if (pageCount >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa2b,"(pageCount <= ((uint32_t)~((uint32_t)0)))","pageCount <= MAXUINT32");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::GetVirtualAllocator
            (&this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            );
  dwSize = pageCount * 0x1000;
  VirtualAllocWrapper::Free
            ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,address,dwSize,0x4000);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SubUsedBytes(&this->
                  super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 ,dwSize);
  pPVar1 = (this->
           super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ).memoryData;
  if (pPVar1 == (PageMemoryData *)0x0) {
    psVar5 = &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).committedBytes;
  }
  else {
    pPVar1->releasePageCount = pPVar1->releasePageCount + pageCount;
    psVar5 = &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).committedBytes;
    *psVar5 = *psVar5 + pageCount * -0x1000;
    pPVar1->decommitPageCount = pPVar1->decommitPageCount + pageCount;
    psVar5 = &pPVar1->currentCommittedPageCount;
    dwSize = pageCount;
  }
  *psVar5 = *psVar5 - dwSize;
  return;
}

Assistant:

void
HeapPageAllocator<T>::DecommitPages(__in char* address, size_t pageCount /* = 1 */)
{
    Assert(pageCount <= MAXUINT32);
#pragma prefast(suppress:__WARNING_WIN32UNRELEASEDVADS, "The remainder of the clean-up is done later.");
    this->GetVirtualAllocator()->Free(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    this->LogFreePages(pageCount);
    this->LogDecommitPages(pageCount);
}